

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

char * ctemplate_htmlparser::entityfilter_process(entityfilter_ctx *ctx,char c)

{
  int iVar1;
  char *pcVar2;
  char c_local;
  entityfilter_ctx *ctx_local;
  
  if (ctx->in_entity == 0) {
    if (c != '&') {
      ctx->output[0] = c;
      ctx->output[1] = '\0';
      return ctx->output;
    }
    ctx->in_entity = 1;
    ctx->buffer_pos = 0;
  }
  else {
    if ((c == ';') || (iVar1 = html_isspace(c), iVar1 != 0)) {
      ctx->in_entity = 0;
      ctx->buffer[ctx->buffer_pos] = '\0';
      ctx->buffer_pos = 0;
      pcVar2 = entity_convert(ctx->buffer,ctx->output,c);
      return pcVar2;
    }
    iVar1 = ctx->buffer_pos;
    ctx->buffer_pos = iVar1 + 1;
    ctx->buffer[iVar1] = c;
    if (7 < ctx->buffer_pos) {
      ctx->buffer[ctx->buffer_pos] = '\0';
      ctx->in_entity = 0;
      ctx->buffer_pos = 0;
      snprintf(ctx->output,10,"&%s",ctx->buffer);
      ctx->output[9] = '\0';
      return ctx->output;
    }
  }
  ctx_local = (entityfilter_ctx *)0x187c99;
  return (char *)ctx_local;
}

Assistant:

const char *entityfilter_process(entityfilter_ctx *ctx, char c)
{
    if (ctx->in_entity) {
        if (c == ';' || html_isspace(c)) {
            ctx->in_entity = 0;
            ctx->buffer[ctx->buffer_pos] = '\0';
            ctx->buffer_pos = 0;
            return entity_convert(ctx->buffer, ctx->output, c);
        } else {
            ctx->buffer[ctx->buffer_pos++] = c;
            if (ctx->buffer_pos >= HTMLPARSER_MAX_ENTITY_SIZE - 2) {
                /* No more buffer to use, finalize and return.
                 * We need two characters left, one for the '&' character and
                 * another for the NULL termination. */
                ctx->buffer[ctx->buffer_pos] = '\0';
                ctx->in_entity=0;
                ctx->buffer_pos = 0;
                snprintf(ctx->output, HTMLPARSER_MAX_ENTITY_SIZE, "&%s",
                         ctx->buffer);
                ctx->output[HTMLPARSER_MAX_ENTITY_SIZE - 1] = '\0';
                return ctx->output;
            }
        }
    } else {
        if (c == '&') {
            ctx->in_entity = 1;
            ctx->buffer_pos = 0;
        } else {
            ctx->output[0] = c;
            ctx->output[1] = 0;
            return ctx->output;
        }
    }
    return "";
}